

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

void __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::push_front
          (intrusive_list<(anonymous_namespace)::TestObject> *this,
          unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
          *node)

{
  pointer pTVar1;
  bool bVar2;
  TestObject *node_p;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  *node_local;
  intrusive_list<(anonymous_namespace)::TestObject> *this_local;
  
  pTVar1 = std::
           unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
           ::operator->(node);
  bVar2 = false;
  if ((pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ ==
      (TestObject *)0x0) {
    pTVar1 = std::
             unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
             ::operator->(node);
    bVar2 = (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ ==
            (TestObject *)0x0;
  }
  if (!bVar2) {
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                  ,0x1a9,
                  "void wabt::intrusive_list<(anonymous namespace)::TestObject>::push_front(std::unique_ptr<T>) [T = (anonymous namespace)::TestObject]"
                 );
  }
  pTVar1 = std::
           unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
           ::release(node);
  if (this->first_ == (TestObject *)0x0) {
    this->last_ = pTVar1;
  }
  else {
    (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = this->first_;
    (this->first_->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar1;
  }
  this->first_ = pTVar1;
  this->size_ = this->size_ + 1;
  return;
}

Assistant:

inline void intrusive_list<T>::push_front(std::unique_ptr<T> node) {
  assert(node->prev_ == nullptr && node->next_ == nullptr);

  T* node_p = node.release();
  if (first_) {
    node_p->next_ = first_;
    first_->prev_ = node_p;
  } else {
    last_ = node_p;
  }
  first_ = node_p;
  size_++;
}